

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

QHostInfo __thiscall QHostInfoAgent::lookup(QHostInfoAgent *this,QString *hostName)

{
  uint uVar1;
  sockaddr *psVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  addrinfo *paVar6;
  QArrayDataPointer<QHostAddress> *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView local_e8;
  QHostAddress addr;
  QHostAddress addr_1;
  QArrayDataPointer<QHostAddress> local_b8;
  undefined1 local_98 [16];
  qsizetype local_88;
  sockaddr *psStack_80;
  char *local_78;
  addrinfo *paStack_70;
  addrinfo *res;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QHostInfo::QHostInfo((QHostInfo *)this,-1);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  QUrl::toAce(&local_58,hostName,0);
  QHostInfo::setHostName((QHostInfo *)this,hostName);
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    **(undefined4 **)this = 1;
    pcVar5 = "Invalid hostname";
    if ((hostName->d).size == 0) {
      pcVar5 = "No host name given";
    }
    this_00 = (QArrayDataPointer<QHostAddress> *)local_98;
LAB_001a29f4:
    QCoreApplication::translate((char *)this_00,"QHostInfoAgent",pcVar5,0);
  }
  else {
    res = (addrinfo *)0x0;
    local_98._8_8_ = (QHostAddress *)0x0;
    local_78 = (char *)0x0;
    paStack_70 = (addrinfo *)0x0;
    local_88 = 0;
    psStack_80 = (sockaddr *)0x0;
    local_98._0_8_ = (Data *)0x20;
    pcVar5 = (char *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    iVar4 = getaddrinfo(pcVar5,(char *)0x0,(addrinfo *)local_98,(addrinfo **)&res);
    if (iVar4 == -1) {
      local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
      pcVar5 = (char *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)&QByteArray::_empty;
      }
      iVar4 = getaddrinfo(pcVar5,(char *)0x0,(addrinfo *)local_98,(addrinfo **)&res);
    }
    if ((iVar4 + 5U < 2) || (iVar4 == -2)) {
      **(undefined4 **)this = 1;
      pcVar5 = "Host not found";
      this_00 = &local_b8;
      goto LAB_001a29f4;
    }
    if (iVar4 == 0) {
      local_b8.size = 0;
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (QHostAddress *)0x0;
      for (paVar6 = res; paVar6 != (addrinfo *)0x0; paVar6 = paVar6->ai_next) {
        if (paVar6->ai_family == 10) {
          addr_1.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QHostAddress::QHostAddress(&addr_1);
          psVar2 = paVar6->ai_addr;
          QHostAddress::setAddress(&addr_1,(quint8 *)(psVar2->sa_data + 6));
          iVar4 = *(int *)(psVar2[1].sa_data + 6);
          if (iVar4 != 0) {
            QString::number((uint)(QArrayDataPointer<char16_t> *)&addr,iVar4);
            QHostAddress::setScopeId(&addr_1,(QString *)&addr);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&addr);
          }
          bVar3 = QListSpecialMethodsBase<QHostAddress>::contains<QHostAddress>
                            ((QListSpecialMethodsBase<QHostAddress> *)&local_b8,&addr_1);
          if (!bVar3) {
            QList<QHostAddress>::emplaceBack<QHostAddress_const&>
                      ((QList<QHostAddress> *)&local_b8,&addr_1);
          }
          QHostAddress::~QHostAddress(&addr_1);
        }
        else if (paVar6->ai_family == 2) {
          addr.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QHostAddress::QHostAddress(&addr);
          uVar1 = *(uint *)(paVar6->ai_addr->sa_data + 2);
          QHostAddress::setAddress
                    (&addr,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                           uVar1 << 0x18);
          bVar3 = QListSpecialMethodsBase<QHostAddress>::contains<QHostAddress>
                            ((QListSpecialMethodsBase<QHostAddress> *)&local_b8,&addr);
          if (!bVar3) {
            QList<QHostAddress>::emplaceBack<QHostAddress_const&>
                      ((QList<QHostAddress> *)&local_b8,&addr);
          }
          QHostAddress::~QHostAddress(&addr);
        }
        else {
          **(undefined4 **)this = 2;
          QCoreApplication::translate((char *)&addr,"QHostInfoAgent","Unknown address type",0);
          QHostInfo::setErrorString((QHostInfo *)this,(QString *)&addr);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&addr);
        }
      }
      if (local_b8.size == 0) {
        **(undefined4 **)this = 2;
        QCoreApplication::translate((char *)&addr,"QHostInfoAgent","Unknown address type",0);
        QHostInfo::setErrorString((QHostInfo *)this,(QString *)&addr);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&addr);
      }
      QHostInfo::setAddresses((QHostInfo *)this,(QList<QHostAddress> *)&local_b8);
      freeaddrinfo((addrinfo *)res);
      QArrayDataPointer<QHostAddress>::~QArrayDataPointer(&local_b8);
      goto LAB_001a2a15;
    }
    **(undefined4 **)this = 2;
    addr.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)gai_strerror(iVar4);
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_e8,(char **)&addr);
    this_00 = &local_b8;
    QVar7.m_data = (storage_type *)local_e8.m_size;
    QVar7.m_size = (qsizetype)this_00;
    QString::fromLocal8Bit(QVar7);
  }
  QHostInfo::setErrorString((QHostInfo *)this,(QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
LAB_001a2a15:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QHostInfo)(QHostInfoPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoAgent::lookup(const QString &hostName)
{
    QHostInfo results;

    // IDN support
    QByteArray aceHostname = QUrl::toAce(hostName);
    results.setHostName(hostName);
    if (aceHostname.isEmpty()) {
        results.setError(QHostInfo::HostNotFound);
        results.setErrorString(hostName.isEmpty() ?
                               QCoreApplication::translate("QHostInfoAgent", "No host name given") :
                               QCoreApplication::translate("QHostInfoAgent", "Invalid hostname"));
        return results;
    }

    addrinfo *res = nullptr;
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = PF_UNSPEC;
#ifdef Q_ADDRCONFIG
    hints.ai_flags = Q_ADDRCONFIG;
#endif

    int result = getaddrinfo(aceHostname.constData(), nullptr, &hints, &res);
# ifdef Q_ADDRCONFIG
    if (result == EAI_BADFLAGS) {
        // if the lookup failed with AI_ADDRCONFIG set, try again without it
        hints.ai_flags = 0;
        result = getaddrinfo(aceHostname.constData(), nullptr, &hints, &res);
    }
# endif

    if (result == 0) {
        addrinfo *node = res;
        QList<QHostAddress> addresses;
        while (node) {
#ifdef QHOSTINFO_DEBUG
            qDebug() << "getaddrinfo node: flags:" << node->ai_flags << "family:" << node->ai_family
                     << "ai_socktype:" << node->ai_socktype << "ai_protocol:" << node->ai_protocol
                     << "ai_addrlen:" << node->ai_addrlen;
#endif
            switch (node->ai_family) {
            case AF_INET: {
                QHostAddress addr;
                addr.setAddress(ntohl(((sockaddr_in *) node->ai_addr)->sin_addr.s_addr));
                if (!addresses.contains(addr))
                    addresses.append(addr);
                break;
            }
            case AF_INET6: {
                QHostAddress addr;
                sockaddr_in6 *sa6 = (sockaddr_in6 *) node->ai_addr;
                addr.setAddress(sa6->sin6_addr.s6_addr);
                if (sa6->sin6_scope_id)
                    addr.setScopeId(QString::number(sa6->sin6_scope_id));
                if (!addresses.contains(addr))
                    addresses.append(addr);
                break;
            }
            default:
                results.setError(QHostInfo::UnknownError);
                results.setErrorString(QCoreApplication::translate("QHostInfoAgent", "Unknown address type"));
            }
            node = node->ai_next;
        }
        if (addresses.isEmpty()) {
            // Reached the end of the list, but no addresses were found; this
            // means the list contains one or more unknown address types.
            results.setError(QHostInfo::UnknownError);
            results.setErrorString(QCoreApplication::translate("QHostInfoAgent", "Unknown address type"));
        }

        results.setAddresses(addresses);
        freeaddrinfo(res);
    } else {
        switch (result) {
#ifdef Q_OS_WIN
        case WSAHOST_NOT_FOUND: //authoritative not found
        case WSATRY_AGAIN: //non authoritative not found
        case WSANO_DATA: //valid name, no associated address
#else
        case EAI_NONAME:
        case EAI_FAIL:
#  ifdef EAI_NODATA // EAI_NODATA is deprecated in RFC 3493
        case EAI_NODATA:
#  endif
#endif
            results.setError(QHostInfo::HostNotFound);
            results.setErrorString(QCoreApplication::translate("QHostInfoAgent", "Host not found"));
            break;
        default:
            results.setError(QHostInfo::UnknownError);
#ifdef Q_OS_WIN
            results.setErrorString(QString::fromWCharArray(gai_strerror(result)));
#else
            results.setErrorString(QString::fromLocal8Bit(gai_strerror(result)));
#endif
            break;
        }
    }

#if defined(QHOSTINFO_DEBUG)
    if (results.error() != QHostInfo::NoError) {
        qDebug("QHostInfoAgent::fromName(): error #%d %s",
               h_errno, results.errorString().toLatin1().constData());
    } else {
        QString tmp;
        QList<QHostAddress> addresses = results.addresses();
        for (int i = 0; i < addresses.count(); ++i) {
            if (i != 0) tmp += ", "_L1;
            tmp += addresses.at(i).toString();
        }
        qDebug("QHostInfoAgent::fromName(): found %i entries for \"%s\": {%s}",
               addresses.count(), aceHostname.constData(),
               tmp.toLatin1().constData());
    }
#endif

    return results;
}